

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::allocate_block(rasterizer_cells_aa<agg::cell_aa> *this)

{
  cell_aa **__dest;
  cell_aa *pcVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = this->m_num_blocks;
  uVar3 = this->m_curr_block;
  if (uVar2 <= uVar3) {
    if (uVar2 < this->m_max_blocks) {
      __dest = this->m_cells;
    }
    else {
      __dest = pod_allocator<agg::cell_aa_*>::allocate(this->m_max_blocks + 0x100);
      if (this->m_cells != (cell_type **)0x0) {
        memcpy(__dest,this->m_cells,(ulong)this->m_max_blocks << 3);
        pod_allocator<agg::cell_aa_*>::deallocate(this->m_cells,this->m_max_blocks);
      }
      this->m_cells = __dest;
      this->m_max_blocks = this->m_max_blocks + 0x100;
      uVar2 = this->m_num_blocks;
      uVar3 = this->m_curr_block;
    }
    pcVar1 = (cell_aa *)operator_new__(0x10000);
    this->m_num_blocks = uVar2 + 1;
    __dest[uVar2] = pcVar1;
  }
  this->m_curr_block = uVar3 + 1;
  this->m_curr_cell_ptr = this->m_cells[uVar3];
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::allocate_block()
    {
        if(m_curr_block >= m_num_blocks)
        {
            if(m_num_blocks >= m_max_blocks)
            {
                cell_type** new_cells = 
                    pod_allocator<cell_type*>::allocate(m_max_blocks + 
                                                        cell_block_pool);

                if(m_cells)
                {
                    memcpy(new_cells, m_cells, m_max_blocks * sizeof(cell_type*));
                    pod_allocator<cell_type*>::deallocate(m_cells, m_max_blocks);
                }
                m_cells = new_cells;
                m_max_blocks += cell_block_pool;
            }

            m_cells[m_num_blocks++] = 
                pod_allocator<cell_type>::allocate(cell_block_size);

        }
        m_curr_cell_ptr = m_cells[m_curr_block++];
    }